

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteMotorConfig(AmpIO *this,uint index,uint32_t cfg)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  bool local_21;
  uint channel;
  bool ret;
  uint32_t cfg_local;
  uint index_local;
  AmpIO *this_local;
  
  local_21 = false;
  uVar3 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar3 < 8) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = HasQLA(this);
    if (((bVar2) && ((this->super_FpgaIO).super_BoardIO.port != (BasePort *)0x0)) &&
       (index < this->NumMotors)) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                         (ulong)((index + 1) * 0x10 | 0xb),(ulong)cfg);
      local_21 = (bool)((byte)iVar4 & 1);
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteMotorConfig(unsigned int index, uint32_t cfg)
{
    bool ret = false;
    if (GetFirmwareVersion() < 8) return ret;

    if (HasQLA() && port && (index < NumMotors)) {
        unsigned int channel = (index+1) << 4;
        ret = port->WriteQuadlet(BoardId, channel | MOTOR_CONFIG_REG, cfg);
    }
    return ret;
}